

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetLowerBound(LoopDependenceAnalysis *this,Loop *loop)

{
  Instruction *instruction;
  Instruction *instruction_00;
  SENode *pSVar1;
  
  instruction = Loop::GetConditionInst(loop);
  if ((instruction == (Instruction *)0x0) ||
     (instruction_00 = GetOperandDefinition(this,instruction,0),
     7 < instruction->opcode_ - OpUGreaterThan)) {
    return (SENode *)0x0;
  }
  if ((instruction_00->opcode_ == OpPhi) &&
     (instruction_00 = GetOperandDefinition(this,instruction_00,0), instruction_00->opcode_ == OpPhi
     )) {
    return (SENode *)0x0;
  }
  pSVar1 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,instruction_00);
  pSVar1 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar1);
  return pSVar1;
}

Assistant:

SENode* LoopDependenceAnalysis::GetLowerBound(const Loop* loop) {
  Instruction* cond_inst = loop->GetConditionInst();
  if (!cond_inst) {
    return nullptr;
  }
  Instruction* lower_inst = GetOperandDefinition(cond_inst, 0);
  switch (cond_inst->opcode()) {
    case spv::Op::OpULessThan:
    case spv::Op::OpSLessThan:
    case spv::Op::OpULessThanEqual:
    case spv::Op::OpSLessThanEqual:
    case spv::Op::OpUGreaterThan:
    case spv::Op::OpSGreaterThan:
    case spv::Op::OpUGreaterThanEqual:
    case spv::Op::OpSGreaterThanEqual: {
      // If we have a phi we are looking at the induction variable. We look
      // through the phi to the initial value of the phi upon entering the loop.
      if (lower_inst->opcode() == spv::Op::OpPhi) {
        lower_inst = GetOperandDefinition(lower_inst, 0);
        // We don't handle looking through multiple phis.
        if (lower_inst->opcode() == spv::Op::OpPhi) {
          return nullptr;
        }
      }
      return scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(lower_inst));
    }
    default:
      return nullptr;
  }
}